

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall UtestShellPointerArray::shuffle(UtestShellPointerArray *this,size_t seed)

{
  UtestShell **ppUVar1;
  UtestShell *pUVar2;
  long *plVar3;
  int iVar4;
  UtestShell *tests;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  bool bVar9;
  
  if (this->count_ != 0) {
    (*PlatformSpecificSrand)((uint)seed);
    uVar6 = this->count_;
    bVar9 = uVar6 != 1;
    if (1 < uVar6) {
      do {
        iVar4 = (*PlatformSpecificRand)();
        ppUVar1 = this->arrayOfTests_;
        pUVar2 = ppUVar1[uVar6 - 1];
        ppUVar1[uVar6 - 1] = ppUVar1[(ulong)(long)iVar4 % uVar6];
        this->arrayOfTests_[(ulong)(long)iVar4 % uVar6] = pUVar2;
        bVar9 = uVar6 != 2;
        if (uVar6 == 2) break;
        uVar6 = uVar6 - 1;
      } while (this->count_ != 0);
    }
    uVar6 = this->count_;
    if (uVar6 != 0 && !bVar9) {
      lVar7 = -8;
      uVar8 = 0;
      uVar5 = 0;
      do {
        plVar3 = *(long **)((long)this->arrayOfTests_ + lVar7 + uVar6 * 8);
        uVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,uVar5);
        uVar8 = uVar8 + 1;
        uVar6 = this->count_;
        lVar7 = lVar7 + -8;
      } while (uVar8 < uVar6);
    }
  }
  return;
}

Assistant:

void UtestShellPointerArray::shuffle(size_t seed)
{
    if (count_ == 0) return;

    PlatformSpecificSrand((unsigned int) seed);

    for (size_t i = count_ - 1; i >= 1; --i)
    {
        if (count_ == 0) return;

        const size_t j = ((size_t)PlatformSpecificRand()) % (i + 1); // distribution biased by modulo, but good enough for shuffling
        swap(i, j);
   }
   relinkTestsInOrder();
}